

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unit.cpp
# Opt level: O0

void __thiscall
Refal2::CUnitList::Duplicate
          (CUnitList *this,CUnitNode *fromNode,CUnitNode *toNode,CUnitNode **fromNodeCopy,
          CUnitNode **toNodeCopy)

{
  CUnitNode *pCVar1;
  bool bVar2;
  CUnitNode **ppCVar3;
  byte local_49;
  CUnitNode *leftParen;
  CUnitNode *node;
  CUnitNode *lastAddedLeftParen;
  CUnitNode **toNodeCopy_local;
  CUnitNode **fromNodeCopy_local;
  CUnitNode *toNode_local;
  CUnitNode *fromNode_local;
  CUnitList *this_local;
  
  CNodeList<Refal2::CUnit>::Duplicate
            (&this->super_CNodeList<Refal2::CUnit>,fromNode,toNode,fromNodeCopy,toNodeCopy);
  node = (CUnitNode *)0x0;
  leftParen = *fromNodeCopy;
  while( true ) {
    if (leftParen == (CUnitNode *)0x0) {
      __assert_fail("node != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                    ,0xd0,
                    "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                   );
    }
    bVar2 = CUnit::IsLeftBracket(&leftParen->super_CUnit);
    local_49 = 0;
    if (!bVar2) {
      bVar2 = CUnit::IsRightBracket(&leftParen->super_CUnit);
      local_49 = bVar2 ^ 0xff;
    }
    if ((local_49 & 1) == 0) {
      __assert_fail("!node->IsLeftBracket() && !node->IsRightBracket()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                    ,0xd1,
                    "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                   );
    }
    bVar2 = CUnit::IsLeftParen(&leftParen->super_CUnit);
    if (bVar2) {
      ppCVar3 = CUnit::PairedParen(&leftParen->super_CUnit);
      *ppCVar3 = node;
      node = leftParen;
    }
    else {
      bVar2 = CUnit::IsRightParen(&leftParen->super_CUnit);
      if (bVar2) {
        if (node == (CUnitNode *)0x0) {
          __assert_fail("leftParen != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                        ,0xd7,
                        "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                       );
        }
        ppCVar3 = CUnit::PairedParen(&node->super_CUnit);
        pCVar1 = *ppCVar3;
        ppCVar3 = CUnit::PairedParen(&leftParen->super_CUnit);
        *ppCVar3 = node;
        ppCVar3 = CUnit::PairedParen(&node->super_CUnit);
        *ppCVar3 = leftParen;
        node = pCVar1;
      }
    }
    if (leftParen == *toNodeCopy) break;
    leftParen = CNode<Refal2::CUnit>::Next(leftParen);
  }
  if (node != (CUnitNode *)0x0) {
    __assert_fail("lastAddedLeftParen == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Unit.cpp"
                  ,0xe0,
                  "virtual void Refal2::CUnitList::Duplicate(const CUnitNode *, const CUnitNode *, CUnitNode *&, CUnitNode *&)"
                 );
  }
  return;
}

Assistant:

void CUnitList::Duplicate( const CUnitNode* fromNode,
	const CUnitNode* toNode, CUnitNode*& fromNodeCopy, CUnitNode*& toNodeCopy )
{
	CNodeList::Duplicate( fromNode, toNode, fromNodeCopy, toNodeCopy );
	CUnitNode* lastAddedLeftParen = nullptr;
	for( CUnitNode* node = fromNodeCopy; ; node = node->Next() ) {
		assert( node != nullptr );
		assert( !node->IsLeftBracket() && !node->IsRightBracket() );
		if( node->IsLeftParen() ) {
			node->PairedParen() = lastAddedLeftParen;
			lastAddedLeftParen = node;
		} else if( node->IsRightParen() ) {
			CUnitNode* leftParen = lastAddedLeftParen;
			assert( leftParen != nullptr );
			lastAddedLeftParen = lastAddedLeftParen->PairedParen();
			node->PairedParen() = leftParen;
			leftParen->PairedParen() = node;
		}
		if( node == toNodeCopy ) {
			break;
		}
	}
	assert( lastAddedLeftParen == nullptr );
}